

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

void __thiscall glcts::LayoutBindingBaseCase::unbind(LayoutBindingBaseCase *this,int binding)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 uVar3;
  
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  uVar2 = *(int *)(CONCAT44(extraout_var,iVar1) + 0xc) - 2;
  uVar3 = 0;
  if (uVar2 < 4) {
    uVar3 = *(undefined4 *)(&DAT_01aee670 + (ulong)uVar2 * 4);
  }
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 8);
  if (iVar1 == 2) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x80))(binding,0,0,0,0,35000,0x822e);
  }
  else if (iVar1 == 1) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 8))(binding + 0x84c0);
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0xb8))(uVar3,0);
    return;
  }
  return;
}

Assistant:

virtual void unbind(int binding)
	{
		glw::GLint texTarget = 0;

		switch (getTestParameters().texture_type)
		{
		case TwoD:
			texTarget = GL_TEXTURE_2D;
			break;
		case TwoDArray:
			texTarget = GL_TEXTURE_2D_ARRAY;
			break;
		case ThreeD:
			texTarget = GL_TEXTURE_3D;
			break;
		default:
			DE_ASSERT(0);
			break;
		}

		switch (getTestParameters().surface_type)
		{
		case Texture:
			gl().activeTexture(GL_TEXTURE0 + binding);
			gl().bindTexture(texTarget, 0);
			break;
		case Image:
			gl().bindImageTexture(binding, 0, 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32F);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}